

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_pcm_interleave_u8(void *dst,void **src,ma_uint64 frameCount,ma_uint32 channels)

{
  ma_uint32 channels_local;
  ma_uint64 frameCount_local;
  void **src_local;
  void *dst_local;
  ulong uStack_60;
  ma_uint32 iChannel;
  ma_uint64 iFrame_1;
  ma_uint64 iFrame;
  ma_uint8 **src_u8;
  ma_uint8 *dst_u8;
  
  if (channels == 1) {
    memcpy(dst,*src,frameCount);
  }
  else if (channels == 2) {
    for (iFrame_1 = 0; iFrame_1 < frameCount; iFrame_1 = iFrame_1 + 1) {
      *(undefined1 *)((long)dst + iFrame_1 * 2) = *(undefined1 *)((long)*src + iFrame_1);
      *(undefined1 *)((long)dst + iFrame_1 * 2 + 1) = *(undefined1 *)((long)src[1] + iFrame_1);
    }
  }
  else {
    for (uStack_60 = 0; uStack_60 < frameCount; uStack_60 = uStack_60 + 1) {
      for (dst_local._4_4_ = 0; dst_local._4_4_ < channels; dst_local._4_4_ = dst_local._4_4_ + 1) {
        *(undefined1 *)((long)dst + uStack_60 * channels + (ulong)dst_local._4_4_) =
             *(undefined1 *)((long)src[dst_local._4_4_] + uStack_60);
      }
    }
  }
  return;
}

Assistant:

MA_API void ma_pcm_interleave_u8(void* dst, const void** src, ma_uint64 frameCount, ma_uint32 channels)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_interleave_u8__reference(dst, src, frameCount, channels);
#else
    ma_pcm_interleave_u8__optimized(dst, src, frameCount, channels);
#endif
}